

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O3

void __thiscall ncnn::DeformableConv2D_x86_fma::destroy_pipeline(DeformableConv2D_x86_fma *this)

{
  Option *in_RSI;
  
  destroy_pipeline((DeformableConv2D_x86_fma *)
                   ((long)&this->_vptr_DeformableConv2D_x86_fma +
                   (long)this->_vptr_DeformableConv2D_x86_fma[-7]),in_RSI);
  return;
}

Assistant:

int DeformableConv2D_x86_fma::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}